

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeAddFunctionCall
              (Parse *pParse,int p1,int p2,int p3,int nArg,FuncDef *pFunc,int eCallCtx)

{
  Vdbe *p;
  int extraout_EAX;
  char *zP4;
  Parse *pPVar1;
  
  p = pParse->pVdbe;
  zP4 = (char *)sqlite3DbMallocRawNN(pParse->db,(long)(nArg * 8 + 0x30));
  if (zP4 != (char *)0x0) {
    zP4[0] = '\0';
    zP4[1] = '\0';
    zP4[2] = '\0';
    zP4[3] = '\0';
    zP4[4] = '\0';
    zP4[5] = '\0';
    zP4[6] = '\0';
    zP4[7] = '\0';
    *(FuncDef **)(zP4 + 8) = pFunc;
    zP4[0x18] = '\0';
    zP4[0x19] = '\0';
    zP4[0x1a] = '\0';
    zP4[0x1b] = '\0';
    zP4[0x1c] = '\0';
    zP4[0x1d] = '\0';
    zP4[0x1e] = '\0';
    zP4[0x1f] = '\0';
    zP4[0x24] = '\0';
    zP4[0x25] = '\0';
    zP4[0x26] = '\0';
    zP4[0x27] = '\0';
    zP4[0x2a] = (char)nArg;
    *(int *)(zP4 + 0x20) = p->nOp;
    sqlite3VdbeAddOp4(p,(eCallCtx == 0) + 0x41,p1,p2,p3,zP4,-0xf);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = (ushort)eCallCtx & 0x2e;
    }
    pPVar1 = pParse->pToplevel;
    if (pParse->pToplevel == (Parse *)0x0) {
      pPVar1 = pParse;
    }
    pPVar1->mayAbort = '\x01';
    return (int)pPVar1;
  }
  freeEphemeralFunction(pParse->db,pFunc);
  return extraout_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeAddFunctionCall(
  Parse *pParse,        /* Parsing context */
  int p1,               /* Constant argument mask */
  int p2,               /* First argument register */
  int p3,               /* Register into which results are written */
  int nArg,             /* Number of argument */
  const FuncDef *pFunc, /* The function to be invoked */
  int eCallCtx          /* Calling context */
){
  Vdbe *v = pParse->pVdbe;
  int nByte;
  int addr;
  sqlite3_context *pCtx;
  assert( v );
  nByte = sizeof(*pCtx) + (nArg-1)*sizeof(sqlite3_value*);
  pCtx = sqlite3DbMallocRawNN(pParse->db, nByte);
  if( pCtx==0 ){
    assert( pParse->db->mallocFailed );
    freeEphemeralFunction(pParse->db, (FuncDef*)pFunc);
    return 0;
  }
  pCtx->pOut = 0;
  pCtx->pFunc = (FuncDef*)pFunc;
  pCtx->pVdbe = 0;
  pCtx->isError = 0;
  pCtx->argc = nArg;
  pCtx->iOp = sqlite3VdbeCurrentAddr(v);
  addr = sqlite3VdbeAddOp4(v, eCallCtx ? OP_PureFunc : OP_Function,
                           p1, p2, p3, (char*)pCtx, P4_FUNCCTX);
  sqlite3VdbeChangeP5(v, eCallCtx & NC_SelfRef);
  sqlite3MayAbort(pParse);
  return addr;
}